

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void glsl_texld(Context *ctx,int texldd)

{
  uint uVar1;
  int iVar2;
  RegisterList *pRVar3;
  uint local_33c;
  char local_338 [8];
  char code_1 [128];
  char local_2ae [6];
  char local_2a8 [2];
  char swiz_str [6];
  char bias [64];
  char *local_260;
  char *biassep;
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char *local_150;
  char *funcname;
  RegisterList *sreg_1;
  SourceArgInfo *samp_arg;
  TextureType ttype;
  RegisterList *sreg;
  char code [128];
  char sampler [64];
  char dst [64];
  DestArgInfo *info;
  int texldd_local;
  Context *ctx_local;
  
  iVar2 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar2 == 0) {
    memset(&sreg,0,0x80);
    if (texldd != 0) {
      __assert_fail("!texldd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0xd3d,"void glsl_texld(Context *, const int)");
    }
    pRVar3 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum);
    if (pRVar3 == (RegisterList *)0x0) {
      local_33c = 0;
    }
    else {
      local_33c = pRVar3->index;
    }
    get_GLSL_destarg_varname(ctx,sampler + 0x38,0x40);
    get_GLSL_varname_in_buf(ctx,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum,code + 0x78,0x40);
    if (local_33c == 2) {
      make_GLSL_destarg_assign
                (ctx,(char *)&sreg,0x80,"texture2D(%s, %s.xy)",code + 0x78,sampler + 0x38);
    }
    else if (local_33c == 3) {
      make_GLSL_destarg_assign
                (ctx,(char *)&sreg,0x80,"textureCube(%s, %s.xyz)",code + 0x78,sampler + 0x38);
    }
    else if (local_33c == 4) {
      make_GLSL_destarg_assign
                (ctx,(char *)&sreg,0x80,"texture3D(%s, %s.xyz)",code + 0x78,sampler + 0x38);
    }
    else {
      fail(ctx,"unexpected texture type");
    }
    output_line(ctx,"%s",&sreg);
  }
  else {
    iVar2 = shader_version_atleast(ctx,'\x02','\0');
    if (iVar2 == 0) {
      fail(ctx,"TEXLD == Shader Model 1.4 unimplemented.");
    }
    else {
      pRVar3 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,ctx->source_args[1].regnum);
      memset(src1 + 0x38,0,0x40);
      get_GLSL_srcarg_varname(ctx,1,src2 + 0x38,0x40);
      memset(src3 + 0x38,0,0x40);
      memset(&biassep,0,0x40);
      if (pRVar3 == (RegisterList *)0x0) {
        fail(ctx,"TEXLD using undeclared sampler");
      }
      else {
        if (texldd != 0) {
          if (pRVar3->index == 2) {
            make_GLSL_srcarg_string_vec2(ctx,2,src3 + 0x38,0x40);
            make_GLSL_srcarg_string_vec2(ctx,3,(char *)&biassep,0x40);
          }
          else {
            if ((pRVar3->index != 3) && (pRVar3->index != 4)) {
              __assert_fail("(sreg->index == TEXTURE_TYPE_CUBE) || (sreg->index == TEXTURE_TYPE_VOLUME)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                            ,0xd82,"void glsl_texld(Context *, const int)");
            }
            make_GLSL_srcarg_string_vec3(ctx,2,src3 + 0x38,0x40);
            make_GLSL_srcarg_string_vec3(ctx,3,(char *)&biassep,0x40);
          }
        }
        local_260 = "";
        memset(local_2a8,0,0x40);
        if (ctx->instruction_controls == 2) {
          local_260 = ", ";
          make_GLSL_srcarg_string_w(ctx,0,local_2a8,0x40);
        }
        uVar1 = pRVar3->index;
        if (uVar1 == 2) {
          if (ctx->instruction_controls == 1) {
            local_150 = "texture2DProj";
            make_GLSL_srcarg_string_full(ctx,0,src1 + 0x38,0x40);
          }
          else {
            local_150 = "texture2D";
            make_GLSL_srcarg_string_vec2(ctx,0,src1 + 0x38,0x40);
          }
        }
        else if (uVar1 == 3) {
          if (ctx->instruction_controls == 1) {
            fail(ctx,"TEXLDP on a cubemap");
          }
          local_150 = "textureCube";
          make_GLSL_srcarg_string_vec3(ctx,0,src1 + 0x38,0x40);
        }
        else {
          if (uVar1 != 4) {
            fail(ctx,"unknown texture type");
            return;
          }
          if (ctx->instruction_controls == 1) {
            local_150 = "texture3DProj";
            make_GLSL_srcarg_string_full(ctx,0,src1 + 0x38,0x40);
          }
          else {
            local_150 = "texture3D";
            make_GLSL_srcarg_string_vec3(ctx,0,src1 + 0x38,0x40);
          }
        }
        iVar2 = isscalar(ctx,ctx->shader_type,ctx->source_args[1].regtype,ctx->source_args[1].regnum
                        );
        if (iVar2 != 0) {
          __assert_fail("!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                        ,0xdb7,"void glsl_texld(Context *, const int)");
        }
        memset(local_2ae,0,6);
        make_GLSL_swizzle_string(local_2ae,6,ctx->source_args[1].swizzle,(ctx->dest_arg).writemask);
        if (texldd == 0) {
          make_GLSL_destarg_assign
                    (ctx,local_338,0x80,"%s(%s, %s%s%s)%s",local_150,src2 + 0x38,src1 + 0x38,
                     local_260,local_2a8,local_2ae);
        }
        else {
          make_GLSL_destarg_assign
                    (ctx,local_338,0x80,"%sGrad(%s, %s, %s, %s)%s",local_150,src2 + 0x38,src1 + 0x38
                     ,src3 + 0x38,&biassep,local_2ae);
        }
        output_line(ctx,"%s",local_338);
      }
    }
  }
  return;
}

Assistant:

static void glsl_texld(Context *ctx, const int texldd)
{
    if (!shader_version_atleast(ctx, 1, 4))
    {
        DestArgInfo *info = &ctx->dest_arg;
        char dst[64];
        char sampler[64];
        char code[128] = {0};

        assert(!texldd);

        RegisterList *sreg;
        sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, info->regnum);
        const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

        // !!! FIXME: this code counts on the register not having swizzles, etc.
        get_GLSL_destarg_varname(ctx, dst, sizeof (dst));
        get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                                sampler, sizeof (sampler));

        if (ttype == TEXTURE_TYPE_2D)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "texture2D(%s, %s.xy)",
                                     sampler, dst);
        }
        else if (ttype == TEXTURE_TYPE_CUBE)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "textureCube(%s, %s.xyz)",
                                     sampler, dst);
        }
        else if (ttype == TEXTURE_TYPE_VOLUME)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "texture3D(%s, %s.xyz)",
                                     sampler, dst);
        }
        else
        {
            fail(ctx, "unexpected texture type");
        } // else
        output_line(ctx, "%s", code);
    } // if

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        // ps_1_4 is different, too!
        fail(ctx, "TEXLD == Shader Model 1.4 unimplemented.");  // !!! FIXME
        return;
    } // else if

    else
    {
        const SourceArgInfo *samp_arg = &ctx->source_args[1];
        RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                          samp_arg->regnum);
        const char *funcname = NULL;
        char src0[64] = { '\0' };
        char src1[64]; get_GLSL_srcarg_varname(ctx, 1, src1, sizeof (src1)); // !!! FIXME: SRC_MOD?
        char src2[64] = { '\0' };
        char src3[64] = { '\0' };

        if (sreg == NULL)
        {
            fail(ctx, "TEXLD using undeclared sampler");
            return;
        } // if

        if (texldd)
        {
            if (sreg->index == TEXTURE_TYPE_2D)
            {
                make_GLSL_srcarg_string_vec2(ctx, 2, src2, sizeof (src2));
                make_GLSL_srcarg_string_vec2(ctx, 3, src3, sizeof (src3));
            } // if
            else
            {
                assert((sreg->index == TEXTURE_TYPE_CUBE) || (sreg->index == TEXTURE_TYPE_VOLUME));
                make_GLSL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                make_GLSL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
            } // else
        } // if

        // !!! FIXME: can TEXLDD set instruction_controls?
        // !!! FIXME: does the d3d bias value map directly to GLSL?
        const char *biassep = "";
        char bias[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDB)
        {
            biassep = ", ";
            make_GLSL_srcarg_string_w(ctx, 0, bias, sizeof (bias));
        } // if

        switch ((const TextureType) sreg->index)
        {
            case TEXTURE_TYPE_2D:
                if (ctx->instruction_controls == CONTROL_TEXLDP)
                {
                    funcname = "texture2DProj";
                    make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
                } // if
                else  // texld/texldb
                {
                    funcname = "texture2D";
                    make_GLSL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
                } // else
                break;
            case TEXTURE_TYPE_CUBE:
                if (ctx->instruction_controls == CONTROL_TEXLDP)
                    fail(ctx, "TEXLDP on a cubemap");  // !!! FIXME: is this legal?
                funcname = "textureCube";
                make_GLSL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
                break;
            case TEXTURE_TYPE_VOLUME:
                if (ctx->instruction_controls == CONTROL_TEXLDP)
                {
                    funcname = "texture3DProj";
                    make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
                } // if
                else  // texld/texldb
                {
                    funcname = "texture3D";
                    make_GLSL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
                } // else
                break;
            default:
                fail(ctx, "unknown texture type");
                return;
        } // switch

        assert(!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum));
        char swiz_str[6] = { '\0' };
        make_GLSL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 samp_arg->swizzle, ctx->dest_arg.writemask);

        char code[128];
        if (texldd)
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "%sGrad(%s, %s, %s, %s)%s", funcname,
                                     src1, src0, src2, src3, swiz_str);
        } // if
        else
        {
            make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                     "%s(%s, %s%s%s)%s", funcname,
                                     src1, src0, biassep, bias, swiz_str);
        } // else

        output_line(ctx, "%s", code);
    } // else
}